

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O0

void lrit::to_json(json *j,SegmentIdentificationHeader *h)

{
  char (*in_stack_fffffffffffffa38) [19];
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffa40;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffa48;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffa50;
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  in_stack_fffffffffffffa58;
  value_t in_stack_ffffffffffffface;
  undefined1 in_stack_fffffffffffffacf;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffad0;
  initializer_list_t in_stack_fffffffffffffad8;
  undefined1 **local_478;
  undefined1 **local_460;
  undefined1 **local_448;
  undefined1 **local_430;
  undefined1 **local_418;
  undefined1 **local_400;
  undefined1 **local_3e8;
  undefined1 **local_3d0;
  undefined1 *local_388 [8];
  undefined8 *local_348;
  undefined8 local_340;
  undefined8 *local_338;
  undefined1 *local_330 [4];
  undefined1 local_310 [32];
  undefined8 *local_2f0;
  undefined8 local_2e8;
  undefined8 *local_2e0;
  undefined1 *local_2d8 [4];
  undefined1 local_2b8 [32];
  undefined8 *local_298;
  undefined8 local_290;
  undefined8 *local_288;
  undefined1 *local_280 [4];
  undefined1 local_260 [32];
  undefined8 *local_240;
  undefined8 local_238;
  undefined8 *local_230;
  undefined1 *local_228 [4];
  undefined1 local_208 [32];
  undefined8 *local_1e8;
  undefined8 local_1e0;
  undefined8 *local_1d8;
  undefined1 *local_1d0 [4];
  undefined1 local_1b0 [32];
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 *local_170;
  undefined1 *local_168 [4];
  undefined1 local_148 [32];
  undefined8 *local_128;
  undefined8 local_120;
  undefined8 *local_118;
  undefined1 *local_110 [4];
  undefined1 local_f0 [32];
  undefined1 local_d0 [32];
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  undefined1 local_70 [32];
  undefined1 local_50 [32];
  undefined8 *local_30;
  undefined8 local_28;
  
  local_118 = local_110;
  local_170 = local_168;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[16]>(in_stack_fffffffffffffa40,(char (*) [16])in_stack_fffffffffffffa38);
  local_170 = (undefined8 *)local_148;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<unsigned_short_const&>
            (in_stack_fffffffffffffa40,(unsigned_short *)in_stack_fffffffffffffa38);
  local_128 = local_168;
  local_120 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffa50,in_stack_fffffffffffffa58);
  local_118 = (undefined8 *)local_f0;
  local_1d8 = local_1d0;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[14]>(in_stack_fffffffffffffa40,(char (*) [14])in_stack_fffffffffffffa38);
  local_1d8 = (undefined8 *)local_1b0;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<unsigned_short_const&>
            (in_stack_fffffffffffffa40,(unsigned_short *)in_stack_fffffffffffffa38);
  local_190 = local_1d0;
  local_188 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffa50,in_stack_fffffffffffffa58);
  local_118 = (undefined8 *)local_d0;
  local_230 = local_228;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[19]>(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  local_230 = (undefined8 *)local_208;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<unsigned_short_const&>
            (in_stack_fffffffffffffa40,(unsigned_short *)in_stack_fffffffffffffa38);
  local_1e8 = local_228;
  local_1e0 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffa50,in_stack_fffffffffffffa58);
  local_118 = (undefined8 *)local_b0;
  local_288 = local_280;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[17]>(in_stack_fffffffffffffa40,(char (*) [17])in_stack_fffffffffffffa38);
  local_288 = (undefined8 *)local_260;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<unsigned_short_const&>
            (in_stack_fffffffffffffa40,(unsigned_short *)in_stack_fffffffffffffa38);
  local_240 = local_280;
  local_238 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffa50,in_stack_fffffffffffffa58);
  local_118 = (undefined8 *)local_90;
  local_2e0 = local_2d8;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[11]>(in_stack_fffffffffffffa40,(char (*) [11])in_stack_fffffffffffffa38);
  local_2e0 = (undefined8 *)local_2b8;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<unsigned_short_const&>
            (in_stack_fffffffffffffa40,(unsigned_short *)in_stack_fffffffffffffa38);
  local_298 = local_2d8;
  local_290 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffa50,in_stack_fffffffffffffa58);
  local_118 = (undefined8 *)local_70;
  local_338 = local_330;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[10]>(in_stack_fffffffffffffa40,(char (*) [10])in_stack_fffffffffffffa38);
  local_338 = (undefined8 *)local_310;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<unsigned_short_const&>
            (in_stack_fffffffffffffa40,(unsigned_short *)in_stack_fffffffffffffa38);
  local_2f0 = local_330;
  local_2e8 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffa50,in_stack_fffffffffffffa58);
  local_118 = (undefined8 *)local_50;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[8]>(in_stack_fffffffffffffa40,(char (*) [8])in_stack_fffffffffffffa38);
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<unsigned_short_const&>
            (in_stack_fffffffffffffa40,(unsigned_short *)in_stack_fffffffffffffa38);
  local_348 = local_388;
  local_340 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffa50,in_stack_fffffffffffffa58);
  local_30 = local_110;
  local_28 = 7;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(in_stack_fffffffffffffad0,in_stack_fffffffffffffad8,(bool)in_stack_fffffffffffffacf,
               in_stack_ffffffffffffface);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::operator=(&in_stack_fffffffffffffa50->owned_value,in_stack_fffffffffffffa48);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&in_stack_fffffffffffffa40->owned_value);
  local_3d0 = (undefined1 **)&local_30;
  do {
    local_3d0 = local_3d0 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x17f50a);
  } while (local_3d0 != local_110);
  local_3e8 = (undefined1 **)&local_348;
  do {
    local_3e8 = local_3e8 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x17f55c);
  } while (local_3e8 != local_388);
  local_400 = (undefined1 **)&local_2f0;
  do {
    local_400 = local_400 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x17f5ae);
  } while (local_400 != local_330);
  local_418 = (undefined1 **)&local_298;
  do {
    local_418 = local_418 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x17f600);
  } while (local_418 != local_2d8);
  local_430 = (undefined1 **)&local_240;
  do {
    local_430 = local_430 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x17f652);
  } while (local_430 != local_280);
  local_448 = (undefined1 **)&local_1e8;
  do {
    local_448 = local_448 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x17f6a4);
  } while (local_448 != local_228);
  local_460 = (undefined1 **)&local_190;
  do {
    local_460 = local_460 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x17f6f6);
  } while (local_460 != local_1d0);
  local_478 = (undefined1 **)&local_128;
  do {
    local_478 = local_478 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x17f748);
  } while (local_478 != local_168);
  return;
}

Assistant:

void to_json(json& j, const SegmentIdentificationHeader& h) {
  j = {
      {"ImageIdentifier", h.imageIdentifier},
      {"SegmentNumber", h.segmentNumber},
      {"SegmentStartColumn", h.segmentStartColumn},
      {"SegmentStartLine", h.segmentStartLine},
      {"MaxSegment", h.maxSegment},
      {"MaxColumn", h.maxColumn},
      {"MaxLine", h.maxLine},
  };
}